

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O2

float __thiscall MetaCommand::GetValueAsFloat(MetaCommand *this,Option *option,string *fieldName)

{
  __type _Var1;
  pointer __lhs;
  float fVar2;
  double dVar3;
  string fieldname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string((string *)&local_38,(string *)fieldName);
  if (fieldName->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&local_38);
  }
  __lhs = (option->fields).
          super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>._M_impl.
          super__Vector_impl_data._M_start;
  do {
    if (__lhs == (option->fields).
                 super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>._M_impl
                 .super__Vector_impl_data._M_finish) {
      fVar2 = 0.0;
LAB_001166ab:
      std::__cxx11::string::~string((string *)&local_38);
      return fVar2;
    }
    _Var1 = std::operator==(&__lhs->name,&local_38);
    if (_Var1) {
      dVar3 = atof((__lhs->value)._M_dataplus._M_p);
      fVar2 = (float)dVar3;
      goto LAB_001166ab;
    }
    __lhs = __lhs + 1;
  } while( true );
}

Assistant:

float MetaCommand::GetValueAsFloat(Option option,METAIO_STL::string fieldName)
{
  METAIO_STL::string fieldname = fieldName;
  if (fieldName.empty()) {
    fieldname = option.name;
  }

  METAIO_STL::vector<Field>::const_iterator itField = option.fields.begin();
  while(itField != option.fields.end())
    {
    if((*itField).name == fieldname)
      {
      return (float)atof((*itField).value.c_str());
      }
    ++itField;
    }
  return 0;
}